

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::EzRpcServer::Impl> __thiscall
kj::
heap<capnp::EzRpcServer::Impl,capnp::Capability::Client,kj::StringPtr&,unsigned_int&,capnp::ReaderOptions&>
          (kj *this,Client *params,StringPtr *params_1,uint *params_2,ReaderOptions *params_3)

{
  Impl *this_00;
  Impl *extraout_RDX;
  Own<capnp::EzRpcServer::Impl> OVar1;
  Own<capnp::ClientHook> local_38;
  
  this_00 = (Impl *)operator_new(0x98);
  local_38.disposer = (params->hook).disposer;
  local_38.ptr = (params->hook).ptr;
  (params->hook).ptr = (ClientHook *)0x0;
  capnp::EzRpcServer::Impl::Impl
            (this_00,(Client *)&local_38,(StringPtr)params_1->content,*params_2,*params_3);
  *(undefined8 **)this = &_::HeapDisposer<capnp::EzRpcServer::Impl>::instance;
  *(Impl **)(this + 8) = this_00;
  Own<capnp::ClientHook>::dispose(&local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}